

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  char *v;
  buffer buf;
  undefined1 local_78 [72];
  
  mtrace();
  uVar4 = 0;
  mpt::array::array((array *)&v,0);
  mpt::io::buffer::buffer(&buf,(array *)&v);
  mpt::reference<mpt::array::content>::~reference((reference<mpt::array::content> *)&v);
  uVar5 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    __s = argv[uVar4];
    strlen(__s);
    mpt::io::buffer::write((ulong)&buf,(void *)0x1,(ulong)__s);
  }
  v = strrchr(*argv,0x2f);
  if (v != (char *)0x0) {
    mpt::encode_array::shift((ulong)local_78);
  }
  do {
    bVar1 = mpt::iterator::get<char_const*>((iterator *)&buf,&v);
    if (!bVar1) break;
    poVar3 = std::operator<<((ostream *)&std::cout,v);
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = mpt::io::buffer::advance();
  } while (0 < iVar2);
  mpt::io::buffer::~buffer(&buf);
  return 0;
}

Assistant:

extern int main(int argc, char * const argv[])
{
	mtrace();
	
	mpt::io::buffer buf;
	
	// write arguments (null-terminated) to buffer
	for (int i = 0; i < argc; ++i) {
		buf.write(1, argv[i], strlen(argv[i]) + 1);
	}
	// consume first argument up to path separator
	const char *v;
	if ((v = std::strrchr(*argv, '/'))) {
		buf.shift(v + 1 - *argv);
	}
	// print arguments in buffer
	while (buf.iterator::get(v)) {
		std::cout << v << std::endl;
		if (buf.advance() <= 0) {
			break;
		}
	}
	return 0;
}